

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode Curl_conn_flush(Curl_easy *data,int sockindex)

{
  CURLcode CVar1;
  
  CVar1 = Curl_conn_cf_cntrl(data->conn->cfilter[sockindex],data,false,0x102,0,(void *)0x0);
  return CVar1;
}

Assistant:

CURLcode Curl_conn_flush(struct Curl_easy *data, int sockindex)
{
  return Curl_conn_cf_cntrl(data->conn->cfilter[sockindex], data, FALSE,
                            CF_CTRL_FLUSH, 0, NULL);
}